

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

void __thiscall
re2::Prog::MarkDominator
          (Prog *this,int root,SparseArray<int> *rootmap,SparseArray<int> *predmap,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *predvec,SparseSet *reachable,vector<int,_std::allocator<int>_> *stk)

{
  bool bVar1;
  InstOp IVar2;
  reference pvVar3;
  ostream *this_00;
  iterator piVar4;
  int *piVar5;
  SparseArray<int> *in_RDX;
  int in_ESI;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_R8;
  SparseSetT<void> *in_R9;
  SparseSetT<void> *in_stack_00000008;
  int pred;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  int id_1;
  const_iterator i;
  Inst *ip;
  int id;
  SparseArray<int> *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb4;
  value_type_conflict2 *in_stack_fffffffffffffdb8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *this_01;
  LogMessage *in_stack_fffffffffffffdc0;
  iterator piVar6;
  SparseSetT<void> *in_stack_fffffffffffffdc8;
  LogMessage *this_02;
  ostream *in_stack_fffffffffffffde8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1f0;
  reference local_1e8;
  int local_1dc;
  iterator local_1d8;
  int local_1d0;
  LogMessage local_1c0;
  Inst *local_40;
  int local_34;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_28;
  SparseArray<int> *local_18;
  int local_c;
  
  local_28 = in_R8;
  local_18 = in_RDX;
  local_c = in_ESI;
  SparseSetT<void>::clear(in_R9);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x2453b5);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdc0,
             in_stack_fffffffffffffdb8);
LAB_002453ca:
  bVar1 = std::vector<int,_std::allocator<int>_>::empty
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdc0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_1d8 = SparseSetT<void>::begin((SparseSetT<void> *)0x2455c8);
    while (piVar6 = local_1d8,
          piVar4 = SparseSetT<void>::end
                             ((SparseSetT<void> *)
                              CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0)),
          piVar6 != piVar4) {
      local_1dc = *local_1d8;
      bVar1 = SparseArray<int>::has_index
                        ((SparseArray<int> *)in_stack_fffffffffffffdc8,(int)((ulong)piVar6 >> 0x20))
      ;
      if (bVar1) {
        this_01 = local_28;
        piVar5 = SparseArray<int>::get_existing
                           ((SparseArray<int> *)
                            CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                            (int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
        local_1e8 = std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[](this_01,(long)*piVar5);
        local_1f0._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffda8);
        std::vector<int,_std::allocator<int>_>::end
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffda8);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                                  (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)in_stack_fffffffffffffda8), bVar1) {
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (&local_1f0);
          bVar1 = SparseSetT<void>::contains(in_stack_fffffffffffffdc8,(int)((ulong)piVar6 >> 0x20))
          ;
          if ((!bVar1) &&
             (bVar1 = SparseArray<int>::has_index
                                ((SparseArray<int> *)in_stack_fffffffffffffdc8,
                                 (int)((ulong)piVar6 >> 0x20)), !bVar1)) {
            in_stack_fffffffffffffda8 = local_18;
            in_stack_fffffffffffffdb4 = local_1dc;
            SparseArray<int>::size(local_18);
            SparseArray<int>::set_new
                      ((SparseArray<int> *)
                       CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                       (int)((ulong)in_stack_fffffffffffffda8 >> 0x20),(int *)0x2456fa);
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_1f0);
        }
      }
      local_1d8 = local_1d8 + 1;
    }
    return;
  }
  pvVar3 = std::vector<int,_std::allocator<int>_>::back
                     ((vector<int,_std::allocator<int>_> *)
                      CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  local_34 = *pvVar3;
  std::vector<int,_std::allocator<int>_>::pop_back((vector<int,_std::allocator<int>_> *)0x245405);
  do {
    bVar1 = SparseSetT<void>::contains
                      (in_stack_fffffffffffffdc8,(int)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
    if ((bVar1) ||
       ((SparseSetT<void>::insert_new
                   ((SparseSetT<void> *)
                    CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                    (int)((ulong)in_stack_fffffffffffffda8 >> 0x20)), local_34 != local_c &&
        (bVar1 = SparseArray<int>::has_index
                           ((SparseArray<int> *)in_stack_fffffffffffffdc8,
                            (int)((ulong)in_stack_fffffffffffffdc0 >> 0x20)), bVar1))))
    goto LAB_002453ca;
    local_40 = inst((Prog *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                    (int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
    IVar2 = Inst::opcode(local_40);
    switch((LogMessage *)(ulong)IVar2) {
    case (LogMessage *)0x0:
    case (LogMessage *)0x1:
      in_stack_fffffffffffffdc8 = in_stack_00000008;
      local_1d0 = Inst::out1(local_40);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                 &in_stack_fffffffffffffda8->size_);
      local_34 = Inst::out(local_40);
      break;
    case (LogMessage *)0x2:
    case (LogMessage *)0x3:
    case (LogMessage *)0x4:
      goto LAB_002453ca;
    case (LogMessage *)0x5:
    case (LogMessage *)0x7:
      goto LAB_002453ca;
    case (LogMessage *)0x6:
      local_34 = Inst::out(local_40);
      break;
    default:
      this_02 = &local_1c0;
      LogMessage::LogMessage
                ((LogMessage *)(ulong)IVar2,(char *)in_stack_fffffffffffffde8,
                 (int)((ulong)this_02 >> 0x20));
      in_stack_fffffffffffffde8 = LogMessage::stream(this_02);
      this_00 = std::operator<<(in_stack_fffffffffffffde8,"unhandled opcode: ");
      IVar2 = Inst::opcode(local_40);
      std::ostream::operator<<(this_00,IVar2);
      LogMessage::~LogMessage(in_stack_fffffffffffffdc0);
      goto LAB_002453ca;
    }
  } while( true );
}

Assistant:

void Prog::MarkDominator(int root, SparseArray<int>* rootmap,
                         SparseArray<int>* predmap,
                         std::vector<std::vector<int>>* predvec,
                         SparseSet* reachable, std::vector<int>* stk) {
  reachable->clear();
  stk->clear();
  stk->push_back(root);
  while (!stk->empty()) {
    int id = stk->back();
    stk->pop_back();
  Loop:
    if (reachable->contains(id))
      continue;
    reachable->insert_new(id);

    if (id != root && rootmap->has_index(id)) {
      // We reached another "tree" via epsilon transition.
      continue;
    }

    Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstAltMatch:
      case kInstAlt:
        stk->push_back(ip->out1());
        id = ip->out();
        goto Loop;

      case kInstByteRange:
      case kInstCapture:
      case kInstEmptyWidth:
        break;

      case kInstNop:
        id = ip->out();
        goto Loop;

      case kInstMatch:
      case kInstFail:
        break;
    }
  }

  for (SparseSet::const_iterator i = reachable->begin();
       i != reachable->end();
       ++i) {
    int id = *i;
    if (predmap->has_index(id)) {
      for (int pred : (*predvec)[predmap->get_existing(id)]) {
        if (!reachable->contains(pred)) {
          // id has a predecessor that cannot be reached from root!
          // Therefore, id must be a "root" too - mark it as such.
          if (!rootmap->has_index(id))
            rootmap->set_new(id, rootmap->size());
        }
      }
    }
  }
}